

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::FileGenerator::GenerateNamespaceOpeners
          (FileGenerator *this,Printer *printer)

{
  size_type sVar1;
  reference value;
  int local_1c;
  int i;
  Printer *printer_local;
  FileGenerator *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->package_parts_);
  if (sVar1 != 0) {
    io::Printer::Print(printer,"\n");
  }
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->package_parts_);
    if (sVar1 <= (ulong)(long)local_1c) break;
    value = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->package_parts_,(long)local_1c);
    io::Printer::Print(printer,"namespace $part$ {\n","part",value);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void FileGenerator::GenerateNamespaceOpeners(io::Printer* printer) {
  if (package_parts_.size() > 0) printer->Print("\n");

  for (int i = 0; i < package_parts_.size(); i++) {
    printer->Print("namespace $part$ {\n",
                   "part", package_parts_[i]);
  }
}